

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

StreamingConcatenationExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::StreamingConcatenationExpressionSyntax,slang::syntax::StreamingConcatenationExpressionSyntax_const&>
          (BumpAllocator *this,StreamingConcatenationExpressionSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  Info *pIVar3;
  ExpressionSyntax *pEVar4;
  size_t sVar5;
  undefined4 uVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  StreamingConcatenationExpressionSyntax *pSVar18;
  
  pSVar18 = (StreamingConcatenationExpressionSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((StreamingConcatenationExpressionSyntax *)this->endPtr < pSVar18 + 1) {
    pSVar18 = (StreamingConcatenationExpressionSyntax *)allocateSlow(this,0xa8,8);
  }
  else {
    this->head->current = (byte *)(pSVar18 + 1);
  }
  (pSVar18->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode =
       (args->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode;
  uVar6 = *(undefined4 *)
           &(args->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.parent;
  (pSVar18->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind =
       (args->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pSVar18->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4 =
       uVar6;
  (pSVar18->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = pSVar1;
  uVar7 = (args->openBrace).field_0x2;
  NVar8.raw = (args->openBrace).numFlags.raw;
  uVar9 = (args->openBrace).rawLen;
  pIVar2 = (args->openBrace).info;
  TVar10 = (args->operatorToken).kind;
  uVar11 = (args->operatorToken).field_0x2;
  NVar12.raw = (args->operatorToken).numFlags.raw;
  uVar13 = (args->operatorToken).rawLen;
  pIVar3 = (args->operatorToken).info;
  pEVar4 = args->sliceSize;
  TVar14 = (args->innerOpenBrace).kind;
  uVar15 = (args->innerOpenBrace).field_0x2;
  NVar16.raw = (args->innerOpenBrace).numFlags.raw;
  uVar17 = (args->innerOpenBrace).rawLen;
  (pSVar18->openBrace).kind = (args->openBrace).kind;
  (pSVar18->openBrace).field_0x2 = uVar7;
  (pSVar18->openBrace).numFlags = (NumericTokenFlags)NVar8.raw;
  (pSVar18->openBrace).rawLen = uVar9;
  (pSVar18->openBrace).info = pIVar2;
  (pSVar18->operatorToken).kind = TVar10;
  (pSVar18->operatorToken).field_0x2 = uVar11;
  (pSVar18->operatorToken).numFlags = (NumericTokenFlags)NVar12.raw;
  (pSVar18->operatorToken).rawLen = uVar13;
  (pSVar18->operatorToken).info = pIVar3;
  pSVar18->sliceSize = pEVar4;
  (pSVar18->innerOpenBrace).kind = TVar14;
  (pSVar18->innerOpenBrace).field_0x2 = uVar15;
  (pSVar18->innerOpenBrace).numFlags = (NumericTokenFlags)NVar16.raw;
  (pSVar18->innerOpenBrace).rawLen = uVar17;
  (pSVar18->innerOpenBrace).info = (args->innerOpenBrace).info;
  (pSVar18->expressions).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->expressions).super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar6 = *(undefined4 *)&(args->expressions).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->expressions).super_SyntaxListBase.super_SyntaxNode.parent;
  (pSVar18->expressions).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->expressions).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pSVar18->expressions).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar6;
  (pSVar18->expressions).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pSVar18->expressions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005d2268;
  (pSVar18->expressions).super_SyntaxListBase.childCount =
       (args->expressions).super_SyntaxListBase.childCount;
  (pSVar18->expressions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005d65b0;
  sVar5 = (args->expressions).elements._M_extent._M_extent_value;
  (pSVar18->expressions).elements._M_ptr = (args->expressions).elements._M_ptr;
  (pSVar18->expressions).elements._M_extent._M_extent_value = sVar5;
  uVar7 = (args->innerCloseBrace).field_0x2;
  NVar8.raw = (args->innerCloseBrace).numFlags.raw;
  uVar9 = (args->innerCloseBrace).rawLen;
  pIVar2 = (args->innerCloseBrace).info;
  TVar10 = (args->closeBrace).kind;
  uVar11 = (args->closeBrace).field_0x2;
  NVar12.raw = (args->closeBrace).numFlags.raw;
  uVar13 = (args->closeBrace).rawLen;
  pIVar3 = (args->closeBrace).info;
  (pSVar18->innerCloseBrace).kind = (args->innerCloseBrace).kind;
  (pSVar18->innerCloseBrace).field_0x2 = uVar7;
  (pSVar18->innerCloseBrace).numFlags = (NumericTokenFlags)NVar8.raw;
  (pSVar18->innerCloseBrace).rawLen = uVar9;
  (pSVar18->innerCloseBrace).info = pIVar2;
  (pSVar18->closeBrace).kind = TVar10;
  (pSVar18->closeBrace).field_0x2 = uVar11;
  (pSVar18->closeBrace).numFlags = (NumericTokenFlags)NVar12.raw;
  (pSVar18->closeBrace).rawLen = uVar13;
  (pSVar18->closeBrace).info = pIVar3;
  return pSVar18;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }